

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O0

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
ptc::osout<char,char[12],int,char[14],char>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,ptc *this,basic_ostream<char,_std::char_traits<char>_> *os,char (*args) [12],int *args_1,
          char (*args_2) [14],char *args_3)

{
  basic_streambuf<char,_std::char_traits<char>_> *sbuf_00;
  ostream *poVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b8;
  undefined1 local_298 [8];
  savebuf<char> sbuf;
  basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_> str;
  basic_streambuf<char,_std::char_traits<char>_> *buf;
  Print<char> printer;
  char *args_local_3;
  char (*args_local_2) [14];
  int *args_local_1;
  char (*args_local) [12];
  basic_ostream<char,_std::char_traits<char>_> *os_local;
  
  printer._96_8_ = args_2;
  Print<char>::Print((Print<char> *)&buf);
  sbuf_00 = (basic_streambuf<char,_std::char_traits<char>_> *)std::ios::rdbuf();
  std::__cxx11::ostringstream::ostringstream((ostringstream *)(sbuf.save.field_2._M_local_buf + 8));
  savebuf<char>::savebuf((savebuf<char> *)local_298,sbuf_00);
  std::ios::rdbuf((streambuf *)(this + *(long *)(*(long *)this + -0x18)));
  poVar1 = std::operator<<((ostream *)((long)&sbuf.save.field_2 + 8),(char *)os);
  pbVar2 = Print<char>::getSep_abi_cxx11_((Print<char> *)&buf);
  std::operator<<(poVar1,(string *)pbVar2);
  poVar1 = (ostream *)std::ostream::operator<<((void *)((long)&sbuf.save.field_2 + 8),*(int *)*args)
  ;
  pbVar2 = Print<char>::getSep_abi_cxx11_((Print<char> *)&buf);
  std::operator<<(poVar1,(string *)pbVar2);
  poVar1 = std::operator<<((ostream *)((long)&sbuf.save.field_2 + 8),(char *)args_1);
  pbVar2 = Print<char>::getSep_abi_cxx11_((Print<char> *)&buf);
  std::operator<<(poVar1,(string *)pbVar2);
  poVar1 = std::operator<<((ostream *)((long)&sbuf.save.field_2 + 8),*(char *)printer._96_8_);
  pbVar2 = Print<char>::getSep_abi_cxx11_((Print<char> *)&buf);
  std::operator<<(poVar1,(string *)pbVar2);
  std::__cxx11::ostringstream::str();
  Print<char>::operator()
            ((Print<char> *)&buf,(basic_ostream<char,_std::char_traits<char>_> *)this,&local_2b8);
  std::__cxx11::string::~string((string *)&local_2b8);
  std::ios::rdbuf((streambuf *)(this + *(long *)(*(long *)this + -0x18)));
  savebuf<char>::str_abi_cxx11_(__return_storage_ptr__,(savebuf<char> *)local_298);
  savebuf<char>::~savebuf((savebuf<char> *)local_298);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)(sbuf.save.field_2._M_local_buf + 8))
  ;
  Print<char>::~Print((Print<char> *)&buf);
  return __return_storage_ptr__;
}

Assistant:

inline const std::basic_string<T> osout( std::basic_ostream<T>& os = select_cout<T>::cout, const Args&... args )
   {
    Print<T> printer;
    std::basic_streambuf<T>* buf = os.rdbuf();
    std::basic_ostringstream<T> str;

    savebuf<T> sbuf( buf );
    os.rdbuf( &sbuf );

    ( ( str << args << printer.getSep() ), ... );
    printer( os, str.str() );
    os.rdbuf( buf );
    return sbuf.str();
   }